

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meshfile_operations.cpp
# Opt level: O2

int optimize_meshfile(map<int,_co_ordinates,_std::less<int>,_std::allocator<std::pair<const_int,_co_ordinates>_>_>
                      *nodes_map,
                     map<int,_node_duplication_data,_std::less<int>,_std::allocator<std::pair<const_int,_node_duplication_data>_>_>
                     *node_duplicated_data_map,
                     map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *materials_map,
                     map<int,_material_duplication_data,_std::less<int>,_std::allocator<std::pair<const_int,_material_duplication_data>_>_>
                     *duplicated_material_data_map)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  ostream *poVar3;
  _Base_ptr p_Var4;
  iterator __position;
  _Base_ptr p_Var5;
  _Rb_tree_node_base *p_Var6;
  _Self __tmp_2;
  int iVar7;
  _Self __tmp_4;
  iterator __position_00;
  _Self __tmp;
  _Rb_tree_node_base *local_2b8;
  _Self __tmp_6;
  pair<int,_material_duplication_data> local_2a4;
  iterator local_298;
  _Rb_tree<int,std::pair<int_const,material_duplication_data>,std::_Select1st<std::pair<int_const,material_duplication_data>>,std::less<int>,std::allocator<std::pair<int_const,material_duplication_data>>>
  *local_290;
  _Rb_tree<int,std::pair<int_const,std::__cxx11::string>,std::_Select1st<std::pair<int_const,std::__cxx11::string>>,std::less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>
  *local_288;
  _Rb_tree<int,std::pair<int_const,node_duplication_data>,std::_Select1st<std::pair<int_const,node_duplication_data>>,std::less<int>,std::allocator<std::pair<int_const,node_duplication_data>>>
  *local_280;
  iterator material_iterator;
  string file_output_name;
  string logf_print_buffer;
  ofstream log_file;
  
  local_290 = (_Rb_tree<int,std::pair<int_const,material_duplication_data>,std::_Select1st<std::pair<int_const,material_duplication_data>>,std::less<int>,std::allocator<std::pair<int_const,material_duplication_data>>>
               *)duplicated_material_data_map;
  local_288 = (_Rb_tree<int,std::pair<int_const,std::__cxx11::string>,std::_Select1st<std::pair<int_const,std::__cxx11::string>>,std::less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>
               *)materials_map;
  std::ofstream::ofstream(&log_file);
  p_Var4 = (nodes_map->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(nodes_map->_M_t)._M_impl.super__Rb_tree_header;
  __tmp_6._M_node = (_Base_ptr)std::_Rb_tree_decrement(&p_Var1->_M_header);
  logf_print_buffer._M_dataplus._M_p = (pointer)&logf_print_buffer.field_2;
  logf_print_buffer._M_string_length = 0;
  logf_print_buffer.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&file_output_name,"logfile.txt",(allocator<char> *)&local_2a4);
  std::ofstream::open((string *)&log_file,(_Ios_Openmode)&file_output_name);
  std::operator<<((ostream *)&log_file,
                  "================== Mesh Duplication Reduction ===============\n");
  std::operator<<((ostream *)&log_file,
                  "--------------------- Original Nodes List -------------------\n");
  for (; (_Rb_tree_header *)p_Var4 != p_Var1; p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
    poVar3 = (ostream *)std::ostream::operator<<(&log_file,p_Var4[1]._M_color);
    std::operator<<(poVar3,": [");
    poVar3 = std::ostream::_M_insert<double>((double)p_Var4[1]._M_parent);
    std::operator<<(poVar3,", ");
    poVar3 = std::ostream::_M_insert<double>((double)p_Var4[1]._M_left);
    std::operator<<(poVar3,", ");
    poVar3 = std::ostream::_M_insert<double>((double)p_Var4[1]._M_right);
    std::operator<<(poVar3,"]\n");
  }
  iVar7 = 0;
  local_280 = (_Rb_tree<int,std::pair<int_const,node_duplication_data>,std::_Select1st<std::pair<int_const,node_duplication_data>>,std::less<int>,std::allocator<std::pair<int_const,node_duplication_data>>>
               *)node_duplicated_data_map;
  for (p_Var4 = (nodes_map->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var4 != __tmp_6._M_node; p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
    __position._M_node = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    while ((_Rb_tree_header *)__position._M_node != p_Var1) {
      bVar2 = co_ord_compare((co_ordinates *)&p_Var4[1]._M_parent,
                             (co_ordinates *)&__position._M_node[1]._M_parent);
      if (bVar2) {
        iVar7 = iVar7 + 1;
        local_2a4.second.duplicated_material_ID = __position._M_node[1]._M_color;
        local_2a4.second.original_material_ID = p_Var4[1]._M_color;
        local_2a4.first = iVar7;
        std::
        _Rb_tree<int,std::pair<int_const,node_duplication_data>,std::_Select1st<std::pair<int_const,node_duplication_data>>,std::less<int>,std::allocator<std::pair<int_const,node_duplication_data>>>
        ::_M_emplace_unique<std::pair<int,node_duplication_data>>
                  (local_280,(pair<int,_node_duplication_data> *)&local_2a4);
        p_Var5 = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
        std::
        _Rb_tree<int,std::pair<int_const,co_ordinates>,std::_Select1st<std::pair<int_const,co_ordinates>>,std::less<int>,std::allocator<std::pair<int_const,co_ordinates>>>
        ::erase_abi_cxx11_((_Rb_tree<int,std::pair<int_const,co_ordinates>,std::_Select1st<std::pair<int_const,co_ordinates>>,std::less<int>,std::allocator<std::pair<int_const,co_ordinates>>>
                            *)nodes_map,__position);
        bVar2 = __position._M_node == __tmp_6._M_node;
        __position._M_node = p_Var5;
        if (bVar2) {
          __tmp_6._M_node = (_Base_ptr)std::_Rb_tree_decrement(&p_Var1->_M_header);
        }
      }
      else {
        __position._M_node = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
      }
    }
  }
  std::operator<<((ostream *)&log_file,
                  "--------------------- Updated Nodes List --------------------\n");
  for (p_Var6 = (nodes_map->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var6 != p_Var1;
      p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
    poVar3 = (ostream *)std::ostream::operator<<(&log_file,p_Var6[1]._M_color);
    std::operator<<(poVar3,": [");
    poVar3 = std::ostream::_M_insert<double>((double)p_Var6[1]._M_parent);
    std::operator<<(poVar3,", ");
    poVar3 = std::ostream::_M_insert<double>((double)p_Var6[1]._M_left);
    std::operator<<(poVar3,", ");
    poVar3 = std::ostream::_M_insert<double>((double)p_Var6[1]._M_right);
    poVar3 = std::operator<<(poVar3,"]");
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  std::operator<<((ostream *)&log_file,
                  "---------------------- Duplicated Nodes ---------------------\n");
  p_Var6 = (_Rb_tree_node_base *)(local_280 + 8);
  for (p_Var4 = *(_Base_ptr *)(local_280 + 0x18); p_Var4 != p_Var6;
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
    poVar3 = std::operator<<((ostream *)&log_file,"Original:  ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(int *)&p_Var4[1].field_0x4);
    poVar3 = std::operator<<(poVar3,"    Duplicate:  ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(int *)&p_Var4[1]._M_parent);
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  p_Var4 = *(_Base_ptr *)(local_288 + 0x18);
  p_Var6 = (_Rb_tree_node_base *)(local_288 + 8);
  material_iterator._M_node = p_Var4;
  local_2b8 = (_Rb_tree_node_base *)std::_Rb_tree_decrement(p_Var6);
  iVar7 = 0;
  while (p_Var4 != local_2b8) {
    local_298._M_node = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    __position_00._M_node = local_298._M_node;
    while (__position_00._M_node != p_Var6) {
      bVar2 = material_compare(&material_iterator,&local_298);
      if (bVar2) {
        iVar7 = iVar7 + 1;
        local_2a4.second.duplicated_material_ID = __position_00._M_node[1]._M_color;
        local_2a4.second.original_material_ID = p_Var4[1]._M_color;
        local_2a4.first = iVar7;
        std::
        _Rb_tree<int,std::pair<int_const,material_duplication_data>,std::_Select1st<std::pair<int_const,material_duplication_data>>,std::less<int>,std::allocator<std::pair<int_const,material_duplication_data>>>
        ::_M_emplace_unique<std::pair<int,material_duplication_data>>(local_290,&local_2a4);
        p_Var5 = (_Base_ptr)std::_Rb_tree_increment(__position_00._M_node);
        local_298._M_node = p_Var5;
        std::
        _Rb_tree<int,std::pair<int_const,std::__cxx11::string>,std::_Select1st<std::pair<int_const,std::__cxx11::string>>,std::less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>
        ::erase_abi_cxx11_(local_288,__position_00);
        bVar2 = local_2b8 == __position_00._M_node;
        __position_00._M_node = p_Var5;
        if (bVar2) {
          local_2b8 = (_Rb_tree_node_base *)std::_Rb_tree_decrement(p_Var6);
        }
      }
      else {
        local_298._M_node = (_Base_ptr)std::_Rb_tree_increment(__position_00._M_node);
        __position_00._M_node = local_298._M_node;
      }
    }
    p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    material_iterator._M_node = p_Var4;
  }
  std::operator<<((ostream *)&log_file,
                  "------------------- Duplicated Materials -------------------\n");
  p_Var6 = (_Rb_tree_node_base *)(local_290 + 8);
  for (p_Var4 = *(_Base_ptr *)(local_290 + 0x18); p_Var4 != p_Var6;
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
    poVar3 = std::operator<<((ostream *)&log_file,"Original:  ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(int *)&p_Var4[1].field_0x4);
    poVar3 = std::operator<<(poVar3,"    Duplicate:  ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(int *)&p_Var4[1]._M_parent);
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  std::ofstream::close();
  std::__cxx11::string::~string((string *)&file_output_name);
  std::__cxx11::string::~string((string *)&logf_print_buffer);
  std::ofstream::~ofstream(&log_file);
  return 0;
}

Assistant:

int optimize_meshfile(  std::map<int, co_ordinates> &nodes_map,
                        std::map<int, node_duplication_data> &node_duplicated_data_map,
                        std::map<int, std::string> &materials_map,
                        std::map<int, material_duplication_data> &duplicated_material_data_map   )
{
    int exit_status = EXIT_FAILURE;
    int duplicates_counter = 0;
    std::ofstream log_file;
    std::map<int, co_ordinates>::iterator main_iterator = nodes_map.begin();
    std::map<int, co_ordinates>::iterator limit = --nodes_map.end();

    std::string logf_print_buffer;
    std::string file_output_name = "logfile.txt";
    log_file.open( file_output_name, std::ios::out | std::ios::app );
    log_file << "================== Mesh Duplication Reduction ===============\n";
    // Display the original node data
    log_file << "--------------------- Original Nodes List -------------------\n";
    while(main_iterator!=nodes_map.end())
    {
        log_file << main_iterator->first
        << ": ["<< main_iterator->second.co_ord[0] << ", "
        << main_iterator->second.co_ord[1] << ", "
        << main_iterator->second.co_ord[2] << "]\n";
        main_iterator++;
    }
    main_iterator = nodes_map.begin();
    // ------------------------------ Node duplication remover --------------------
    while(main_iterator != limit)
    {
        std::map<int, co_ordinates>::iterator nested_iterator = main_iterator;
        nested_iterator++;
        while(nested_iterator != nodes_map.end())
        {
            //compare with next
            if(co_ord_compare( main_iterator->second, nested_iterator->second ) == true)
            {
                // add co-ords to dupe data map
                node_duplication_data duplication;
                duplication.original_node = main_iterator->first;
                duplication.duplicated_node = nested_iterator->first;
                node_duplicated_data_map.insert(std::pair<int, node_duplication_data>(++duplicates_counter, duplication));
                //delete the duplicate
                std::map<int, co_ordinates>::iterator holder_iterator = nested_iterator;
                nested_iterator++;
                nodes_map.erase(holder_iterator);
                if (holder_iterator==limit)
                    limit = --nodes_map.end();
            }
            else
            {
                nested_iterator++;
            }
        }
        main_iterator++;
    }
    //print nodes map
    log_file << "--------------------- Updated Nodes List --------------------\n";
    main_iterator=nodes_map.begin();
    while(main_iterator != nodes_map.end())
    {
        log_file << main_iterator->first
        << ": ["
        << main_iterator->second.co_ord[0]
        << ", "
        << main_iterator->second.co_ord[1]
        << ", "
        << main_iterator->second.co_ord[2]
        << "]"
        << std::endl;
        main_iterator++;
    }
    //print dupe list
    log_file << "---------------------- Duplicated Nodes ---------------------\n";
    std::map<int, node_duplication_data>::iterator dupe_iterator = node_duplicated_data_map.begin();
    while (dupe_iterator != node_duplicated_data_map.end())
    {
        log_file << "Original:  " << dupe_iterator->second.original_node <<"    Duplicate:  " << dupe_iterator->second.duplicated_node << std::endl;
        dupe_iterator++;
    }
    // Material duplication remover ---------------------------------------------------------------------------------------
    std::map<int, std::string>::iterator material_iterator = materials_map.begin();
    int material_duplicates_counter = 0;
    std::map<int, std::string>::iterator materials_map_limit = --materials_map.end();
    while(material_iterator != materials_map_limit)
    {
        std::map<int, std::string>::iterator nested_material_iterator = material_iterator;
        nested_material_iterator++;
        while (nested_material_iterator != materials_map.end())
        {
            if (material_compare(material_iterator, nested_material_iterator) == true)
            {
                material_duplication_data identified_material_duplication;
                identified_material_duplication.original_material_ID = material_iterator->first;
                identified_material_duplication.duplicated_material_ID = nested_material_iterator->first;
                duplicated_material_data_map.insert(
                std::pair<int, material_duplication_data>(++material_duplicates_counter, identified_material_duplication));
                //delete the duplicate
                std::map<int, std::string>::iterator material_holder_iterator = nested_material_iterator;
                nested_material_iterator++;
                materials_map.erase(material_holder_iterator);
                if(material_holder_iterator==materials_map_limit)
                    materials_map_limit = --materials_map.end();
            }
            else
            {
                nested_material_iterator++;
            }
        }
        material_iterator++;
    }
    // Print duplication list of materials for DEBUG purposes
    log_file <<  "------------------- Duplicated Materials -------------------\n";
    std::map<int, material_duplication_data>::iterator material_dupe_iterator = duplicated_material_data_map.begin();
    while (material_dupe_iterator != duplicated_material_data_map.end())
    {
        log_file << "Original:  " << material_dupe_iterator->second.original_material_ID
        <<"    Duplicate:  " << material_dupe_iterator->second.duplicated_material_ID << std::endl;
        material_dupe_iterator++;
    }

    // end material duplication remover ------------------------------------------------------------------------------------
    exit_status = EXIT_SUCCESS;
    log_file.close();
    return exit_status;
}